

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitCall(I64ToI32Lowering *this,Call *curr)

{
  Function *pFVar1;
  Call *pCVar2;
  Signature SVar3;
  Fatal local_220;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  IString local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  Call *local_28;
  Call *curr_local;
  
  local_28 = curr;
  if (curr->isReturn == true) {
    pFVar1 = Module::getFunction((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 .
                                 super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 .currModule,(Name)(curr->target).super_IString.str);
    SVar3 = HeapType::getSignature(&pFVar1->type);
    if (SVar3.results.id.id == 3) {
      Fatal::Fatal(&local_220);
      Fatal::operator<<(&local_220,
                        (char (*) [62])
                        "i64 to i32 lowering of return_call values not yet implemented");
      Fatal::~Fatal(&local_220);
    }
  }
  local_98._8_8_ = &local_28;
  local_80 = std::
             _Function_handler<wasm::Call_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:264:13)>
             ::_M_invoke;
  local_88 = std::
             _Function_handler<wasm::Call_*(std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_&,_wasm::Type),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp:264:13)>
             ::_M_manager;
  local_98._M_unused._M_object = this;
  pCVar2 = visitGenericCall<wasm::Call>(this,curr,(BuilderFunc<wasm::Call> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  if (pCVar2 != (Call *)0x0) {
    pFVar1 = Module::getFunction((this->
                                 super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                 ).
                                 super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 .
                                 super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                                 .currModule,(Name)(pCVar2->target).super_IString.str);
    if ((pFVar1->super_Importable).module.super_IString.str._M_str != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"legalfunc$",(allocator<char> *)((long)&curr_local + 7));
      IString::toString_abi_cxx11_(&local_48,&(pCVar2->target).super_IString);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_220
                     ,&local_68,&local_48);
      IString::IString(&local_78,(string *)&local_220);
      (pCVar2->target).super_IString.str._M_len = local_78.str._M_len;
      (pCVar2->target).super_IString.str._M_str = local_78.str._M_str;
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  return;
}

Assistant:

void visitCall(Call* curr) {
    if (curr->isReturn &&
        getModule()->getFunction(curr->target)->getResults() == Type::i64) {
      Fatal()
        << "i64 to i32 lowering of return_call values not yet implemented";
    }
    auto* fixedCall = visitGenericCall<Call>(
      curr, [&](std::vector<Expression*>& args, Type results) {
        return builder->makeCall(curr->target, args, results, curr->isReturn);
      });
    // If this was to an import, we need to call the legal version. This assumes
    // that legalize-js-interface has been run before.
    if (fixedCall && getModule()->getFunction(fixedCall->target)->imported()) {
      fixedCall->target =
        std::string("legalfunc$") + fixedCall->target.toString();
      return;
    }
  }